

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementText.cpp
# Opt level: O3

void Rml::LogMissingFontFace(Element *element)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  _Alloc_hider _Var3;
  ComputedValues *pCVar4;
  String font_face_description;
  String font_family_property;
  String local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  String local_38;
  
  paVar1 = &local_78.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"font-family","");
  Element::GetProperty<std::__cxx11::string>(&local_58,element,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (local_58._M_string_length == 0) {
    Element::GetAddress_abi_cxx11_(&local_78,element,false,true);
    Log::Message(LT_WARNING,"No font face defined. Missing \'font-family\' property. On element %s",
                 local_78._M_dataplus._M_p);
  }
  else {
    pCVar4 = Element::GetComputedValues(element);
    uVar2 = *(uint *)&(pCVar4->inherited).field_0x14;
    GetFontFaceDescription
              (&local_78,&local_58,(FontStyle)(uVar2 >> 0xb) & Italic,(FontWeight)uVar2 & 0x3ff);
    _Var3._M_p = local_78._M_dataplus._M_p;
    Element::GetAddress_abi_cxx11_(&local_38,element,false,true);
    Log::Message(LT_WARNING,
                 "No font face defined. Ensure (1) that Context::Update is run after new elements are constructed, before Context::Render, and (2) that the specified font face %s has been successfully loaded. Please see previous log messages for all successfully loaded fonts. On element %s"
                 ,_Var3._M_p,local_38._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void LogMissingFontFace(Element* element)
{
	const String font_family_property = element->GetProperty<String>("font-family");
	if (font_family_property.empty())
	{
		Log::Message(Log::LT_WARNING, "No font face defined. Missing 'font-family' property. On element %s", element->GetAddress().c_str());
	}
	else
	{
		const ComputedValues& computed = element->GetComputedValues();
		const String font_face_description = GetFontFaceDescription(font_family_property, computed.font_style(), computed.font_weight());
		Log::Message(Log::LT_WARNING,
			"No font face defined. Ensure (1) that Context::Update is run after new elements are constructed, before Context::Render, "
			"and (2) that the specified font face %s has been successfully loaded. "
			"Please see previous log messages for all successfully loaded fonts. On element %s",
			font_face_description.c_str(), element->GetAddress().c_str());
	}
}